

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::TryCatchStatement(SQCompiler *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  SQObjectType SVar5;
  SQUnsignedInteger SVar6;
  longlong *plVar7;
  SQInteger SVar8;
  SQInteger SVar9;
  SQInteger arg2;
  SQInteger SVar10;
  SQObjectValue name;
  SQObjectValue n;
  SQInteger in_RDI;
  SQObject SVar11;
  SQInteger oldouters_1;
  SQInteger ex_target;
  SQScope __oldscope___1;
  bool in_stack_0000004f;
  SQCompiler *in_stack_00000050;
  SQInteger jmppos;
  SQInteger oldouters;
  SQScope __oldscope__;
  SQInteger trappos;
  SQObject exid;
  SQCompiler *in_stack_ffffffffffffff40;
  SQInteger in_stack_ffffffffffffff48;
  SQInteger in_stack_ffffffffffffff50;
  SQInteger in_stack_ffffffffffffff60;
  long lVar12;
  SQInteger in_stack_ffffffffffffff68;
  SQOpcode _op;
  SQFuncState *in_stack_ffffffffffffff70;
  SQFuncState *this_00;
  undefined4 in_stack_ffffffffffffff84;
  SQInteger in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffb4;
  SQCompiler *in_stack_ffffffffffffffe8;
  
  Lex(in_stack_ffffffffffffff40);
  SQFuncState::AddInstruction
            (in_stack_ffffffffffffff70,(SQOpcode)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             in_stack_ffffffffffffff60,in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  *(long *)(*(long *)(in_RDI + 8) + 0x1c0) = *(long *)(*(long *)(in_RDI + 8) + 0x1c0) + 1;
  SVar6 = sqvector<long_long>::size((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x170));
  if (SVar6 != 0) {
    plVar7 = sqvector<long_long>::top((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x170));
    *plVar7 = *plVar7 + 1;
  }
  SVar6 = sqvector<long_long>::size((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x188));
  if (SVar6 != 0) {
    plVar7 = sqvector<long_long>::top((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x188));
    *plVar7 = *plVar7 + 1;
  }
  SVar8 = SQFuncState::GetCurrentPos((SQFuncState *)0x11660a);
  uVar1 = *(undefined8 *)(in_RDI + 0xe8);
  uVar2 = *(undefined8 *)(in_RDI + 0xf0);
  *(undefined8 *)(in_RDI + 0xe8) = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x1c8);
  SVar9 = SQFuncState::GetStackSize((SQFuncState *)0x116653);
  *(SQInteger *)(in_RDI + 0xf0) = SVar9;
  Statement(in_stack_00000050,in_stack_0000004f);
  lVar12 = *(long *)(*(long *)(in_RDI + 8) + 0x1c8);
  SVar9 = SQFuncState::GetStackSize((SQFuncState *)0x11668a);
  if ((SVar9 != *(long *)(in_RDI + 0xf0)) &&
     (SQFuncState::SetStackSize
                ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88), lVar12 != *(long *)(*(long *)(in_RDI + 8) + 0x1c8))) {
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffff70,(SQOpcode)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               in_stack_ffffffffffffff60,in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
    ;
  }
  *(undefined8 *)(in_RDI + 0xe8) = uVar1;
  *(undefined8 *)(in_RDI + 0xf0) = uVar2;
  *(long *)(*(long *)(in_RDI + 8) + 0x1c0) = *(long *)(*(long *)(in_RDI + 8) + 0x1c0) + -1;
  SQFuncState::AddInstruction
            (in_stack_ffffffffffffff70,(SQOpcode)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             in_stack_ffffffffffffff60,in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  SVar6 = sqvector<long_long>::size((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x170));
  if (SVar6 != 0) {
    plVar7 = sqvector<long_long>::top((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x170));
    *plVar7 = *plVar7 + -1;
  }
  SVar6 = sqvector<long_long>::size((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x188));
  if (SVar6 != 0) {
    plVar7 = sqvector<long_long>::top((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x188));
    *plVar7 = *plVar7 + -1;
  }
  SQFuncState::AddInstruction
            (in_stack_ffffffffffffff70,(SQOpcode)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             in_stack_ffffffffffffff60,in_RDI,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  arg2 = SQFuncState::GetCurrentPos((SQFuncState *)0x1167e8);
  SQFuncState::GetCurrentPos((SQFuncState *)0x116816);
  SQFuncState::SetInstructionParam
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_RDI);
  SVar11 = Expect(in_stack_ffffffffffffffe8,SVar8);
  SVar3 = SVar11._type;
  SVar11 = Expect(in_stack_ffffffffffffffe8,SVar8);
  name = SVar11._unVal;
  SVar11 = Expect(in_stack_ffffffffffffffe8,SVar8);
  SVar4 = SVar11._type;
  SVar11 = Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff94,SVar4),SVar8);
  n = SVar11._unVal;
  SVar5 = SVar11._type;
  this_00 = *(SQFuncState **)(in_RDI + 0xe8);
  SVar8 = *(SQInteger *)(in_RDI + 0xf0);
  *(undefined8 *)(in_RDI + 0xe8) = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x1c8);
  SVar9 = SQFuncState::GetStackSize((SQFuncState *)0x1168eb);
  *(SQInteger *)(in_RDI + 0xf0) = SVar9;
  SVar10 = SQFuncState::PushLocalVariable
                     ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffb4,SVar3),name.nInteger);
  SQFuncState::SetInstructionParam(this_00,SVar10,in_stack_ffffffffffffff60,in_RDI);
  Statement(in_stack_00000050,in_stack_0000004f);
  SVar9 = *(SQInteger *)(in_RDI + 8);
  SQFuncState::GetCurrentPos((SQFuncState *)0x116965);
  SQFuncState::SetInstructionParams
            ((SQFuncState *)CONCAT44(in_stack_ffffffffffffff84,SVar5),SVar8,(SQInteger)this_00,
             SVar10,in_stack_ffffffffffffff60,in_RDI);
  _op = (SQOpcode)((ulong)SVar10 >> 0x20);
  lVar12 = *(long *)(*(long *)(in_RDI + 8) + 0x1c8);
  SVar10 = SQFuncState::GetStackSize((SQFuncState *)0x1169a8);
  if ((SVar10 != *(long *)(in_RDI + 0xf0)) &&
     (SQFuncState::SetStackSize((SQFuncState *)CONCAT44(in_stack_ffffffffffffff94,SVar4),n.nInteger)
     , lVar12 != *(long *)(*(long *)(in_RDI + 8) + 0x1c8))) {
    SQFuncState::AddInstruction(this_00,_op,lVar12,in_RDI,arg2,SVar9);
  }
  *(SQFuncState **)(in_RDI + 0xe8) = this_00;
  *(SQInteger *)(in_RDI + 0xf0) = SVar8;
  return;
}

Assistant:

void TryCatchStatement()
    {
        SQObject exid;
        Lex();
        _fs->AddInstruction(_OP_PUSHTRAP,0,0);
        _fs->_traps++;
        if(_fs->_breaktargets.size()) _fs->_breaktargets.top()++;
        if(_fs->_continuetargets.size()) _fs->_continuetargets.top()++;
        SQInteger trappos = _fs->GetCurrentPos();
        {
            BEGIN_SCOPE();
            Statement();
            END_SCOPE();
        }
        _fs->_traps--;
        _fs->AddInstruction(_OP_POPTRAP, 1, 0);
        if(_fs->_breaktargets.size()) _fs->_breaktargets.top()--;
        if(_fs->_continuetargets.size()) _fs->_continuetargets.top()--;
        _fs->AddInstruction(_OP_JMP, 0, 0);
        SQInteger jmppos = _fs->GetCurrentPos();
        _fs->SetInstructionParam(trappos, 1, (_fs->GetCurrentPos() - trappos));
        Expect(TK_CATCH); Expect(_SC('(')); exid = Expect(TK_IDENTIFIER); Expect(_SC(')'));
        {
            BEGIN_SCOPE();
            SQInteger ex_target = _fs->PushLocalVariable(exid);
            _fs->SetInstructionParam(trappos, 0, ex_target);
            Statement();
            _fs->SetInstructionParams(jmppos, 0, (_fs->GetCurrentPos() - jmppos), 0);
            END_SCOPE();
        }
    }